

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall ot::commissioner::Interpreter::PrintOrExport(Interpreter *this,Value *aValue)

{
  pointer pbVar1;
  ErrorCode EVar2;
  char *begin;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer aPath;
  string_view fmt;
  format_args args;
  undefined1 local_f8 [8];
  _Alloc_hider _Stack_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  code *local_d0;
  string output;
  Error error;
  string out;
  string filePath;
  
  Value::ToString_abi_cxx11_(&output,aValue);
  if ((aValue->mError).mCode == kNone) {
    aPath = (this->mContext).mExportFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 != aPath) {
      error.mCode = kNone;
      error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
      error.mMessage._M_string_length = 0;
      error.mMessage.field_2._M_local_buf[0] = '\0';
      while( true ) {
        if (aPath == pbVar1) goto LAB_0019c105;
        std::__cxx11::string::string((string *)&filePath,(string *)aPath);
        RestoreFilePath((Error *)local_f8,aPath);
        Error::operator=(&error,(Error *)local_f8);
        std::__cxx11::string::~string((string *)&_Stack_f0);
        EVar2 = error.mCode;
        local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
        _Stack_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_allocated_capacity = local_e0._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::~string((string *)&_Stack_f0);
        if (EVar2 != kNone) {
          Console::Write(&error.mMessage,kRed);
          goto LAB_0019c0f8;
        }
        Value::ToString_abi_cxx11_(&out,aValue);
        WriteFile((Error *)local_f8,&out,&filePath);
        Error::operator=(&error,(Error *)local_f8);
        std::__cxx11::string::~string((string *)&_Stack_f0);
        std::__cxx11::string::~string((string *)&out);
        EVar2 = error.mCode;
        local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
        _Stack_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_allocated_capacity = local_e0._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::~string((string *)&_Stack_f0);
        if (EVar2 != kNone) break;
        std::__cxx11::string::~string((string *)&filePath);
        aPath = aPath + 1;
      }
      local_f8._0_4_ = string_type;
      _Stack_f0._M_p = "failed to write to \'{}\'\n";
      local_e8 = 0x18;
      local_e0._M_allocated_capacity = 0x100000000;
      local_d0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar3 = "failed to write to \'{}\'\n";
      local_e0._8_8_ = local_f8;
      while (begin = pcVar3, begin != "") {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char> *)local_f8);
        }
      }
      local_f8 = (undefined1  [8])filePath._M_dataplus._M_p;
      _Stack_f0._M_p = (pointer)filePath._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x18;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_f8;
      ::fmt::v10::vformat_abi_cxx11_(&out,(v10 *)"failed to write to \'{}\'\n",fmt,args);
      Console::Write(&out,kRed);
      std::__cxx11::string::~string((string *)&out);
LAB_0019c0f8:
      std::__cxx11::string::~string((string *)&filePath);
LAB_0019c105:
      EVar2 = error.mCode;
      local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
      _Stack_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_allocated_capacity = local_e0._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::~string((string *)&_Stack_f0);
      if (EVar2 == kNone) {
        output._M_string_length = 0;
        *output._M_dataplus._M_p = '\0';
      }
      std::__cxx11::string::~string((string *)&error.mMessage);
    }
  }
  if (output._M_string_length != 0) {
    std::__cxx11::string::append((char *)&output);
  }
  std::__cxx11::string::append((char *)&output);
  Console::Write(&output,((aValue->mError).mCode == kNone) + kRed);
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void Interpreter::PrintOrExport(const Value &aValue)
{
    std::string output = aValue.ToString();

    if (aValue.HasNoError() && mContext.mExportFiles.size() > 0)
    {
        Error error;

        for (const auto &path : mContext.mExportFiles)
        {
            std::string filePath = path;

            // Make sure folder path exists, if it's not creatable, print error and output to console instead
            error = RestoreFilePath(path);
            if (error != ERROR_NONE)
            {
                Console::Write(error.GetMessage(), Console::Color::kRed);
                break;
            }
            ///
            /// @todo: maybe instead of overwriting an existing file
            ///        suggest a new file name by incrementing suffix
            ///        filePath[-suffix].ext
            ///
            error = WriteFile(aValue.ToString(), filePath);
            if (error != ERROR_NONE)
            {
                std::string out = fmt::format(FMT_STRING("failed to write to '{}'\n"), filePath);
                Console::Write(out, Console::Color::kRed);
                break;
            }
        }
        if (error == ERROR_NONE)
        {
            // value is written to file, no console output expected other than
            // [done]/[failed]
            output.clear();
        }
    }
    if (!output.empty())
    {
        output += "\n";
    }
    output += aValue.HasNoError() ? "[done]" : "[failed]";
    auto color = aValue.HasNoError() ? Console::Color::kGreen : Console::Color::kRed;

    Console::Write(output, color);
}